

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O2

void apply_deadliness(int *die_average,wchar_t deadliness)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  wchar_t wVar4;
  
  wVar4 = L'\x96';
  if (deadliness < L'\x96') {
    wVar4 = deadliness;
  }
  uVar3 = 0xffffff6a;
  if (L'\xffffff6a' < wVar4) {
    uVar3 = (ulong)(uint)wVar4;
  }
  if (deadliness < L'\0') {
    iVar2 = 0;
    if (99 < deadliness_conversion[(uint)-(int)uVar3]) goto LAB_00194e10;
    uVar1 = -(uint)deadliness_conversion[(uint)-(int)uVar3];
  }
  else {
    uVar1 = (uint)deadliness_conversion[uVar3];
  }
  iVar2 = (uVar1 + 100) * *die_average;
LAB_00194e10:
  *die_average = iVar2;
  return;
}

Assistant:

void apply_deadliness(int *die_average, int deadliness)
{
	int i;

	/* Paranoia - ensure legal table access. */
	if (deadliness > 150)
		deadliness = 150;
	if (deadliness < -150)
		deadliness = -150;

	/* Deadliness is positive - damage is increased */
	if (deadliness >= 0) {
		i = deadliness_conversion[deadliness];

		*die_average *= (100 + i);
	}

	/* Deadliness is negative - damage is decreased */
	else {
		i = deadliness_conversion[ABS(deadliness)];

		if (i >= 100)
			*die_average = 0;
		else
			*die_average *= (100 - i);
	}
}